

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBcontig8bitCMYKMaptile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  TIFFRGBValue *pTVar2;
  long lVar3;
  ushort uVar4;
  long lVar5;
  bool bVar6;
  
  uVar1 = img->samplesperpixel;
  pTVar2 = img->Map;
  while (bVar6 = h != 0, h = h - 1, bVar6) {
    lVar5 = (long)toskew * -4;
    for (lVar3 = 0; w != (uint32_t)lVar3; lVar3 = lVar3 + 1) {
      uVar4 = pp[3] ^ 0xff;
      cp[lVar3] = CONCAT12(pTVar2[(ushort)((pp[2] ^ 0xff) * uVar4) / 0xff],
                           CONCAT11(pTVar2[(ushort)((pp[1] ^ 0xff) * uVar4) / 0xff],
                                    pTVar2[(ushort)((*pp ^ 0xff) * uVar4) / 0xff])) | 0xff000000;
      pp = pp + uVar1;
      lVar5 = lVar5 + -4;
    }
    pp = pp + (int)(fromskew * (uint)uVar1);
    cp = (uint32_t *)((long)cp - lVar5);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bitCMYKMaptile)
{
    int samplesperpixel = img->samplesperpixel;
    TIFFRGBValue *Map = img->Map;
    uint16_t r, g, b, k;

    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            k = 255 - pp[3];
            r = (k * (255 - pp[0])) / 255;
            g = (k * (255 - pp[1])) / 255;
            b = (k * (255 - pp[2])) / 255;
            *cp++ = PACK(Map[r], Map[g], Map[b]);
            pp += samplesperpixel;
        }
        pp += fromskew;
        cp += toskew;
    }
}